

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fibonacci_heap.cpp
# Opt level: O0

FibHeap fib_heap_union(FibHeap h1,FibHeap h2)

{
  FibHeap tmp;
  FibHeap h2_local;
  FibHeap h1_local;
  
  h1_local = h2;
  if ((h1 != (FibHeap)0x0) && (h1_local = h1, h2 != (FibHeap)0x0)) {
    tmp = h2;
    h2_local = h1;
    if (h1->maxDegree < h2->maxDegree) {
      tmp = h1;
      h2_local = h2;
    }
    if (h2_local->min == (_FibonacciNode *)0x0) {
      h2_local->min = tmp->min;
      h2_local->keyNum = tmp->keyNum;
      free(tmp->cons);
      free(tmp);
    }
    else if (tmp->min == (_FibonacciNode *)0x0) {
      free(tmp->cons);
      free(tmp);
    }
    else {
      fib_node_cat(h2_local->min,tmp->min);
      if (tmp->min->key < h2_local->min->key) {
        h2_local->min = tmp->min;
      }
      h2_local->keyNum = tmp->keyNum + h2_local->keyNum;
      free(tmp->cons);
      free(tmp);
    }
    h1_local = h2_local;
  }
  return h1_local;
}

Assistant:

FibHeap fib_heap_union(FibHeap h1, FibHeap h2) {
    FibHeap tmp;

    if (h1 == NULL)
        return h2;
    if (h2 == NULL)
        return h1;

    // 以h1为"母"，将h2附加到h1上；下面是保证h1的度数大，尽可能的少操作。
    if (h2->maxDegree > h1->maxDegree) {
        tmp = h1;
        h1 = h2;
        h2 = tmp;
    }

    if ((h1->min) == NULL)                // h1无"最小节点"
    {
        h1->min = h2->min;
        h1->keyNum = h2->keyNum;
        free(h2->cons);
        free(h2);
    } else if ((h2->min) == NULL)           // h1有"最小节点" && h2无"最小节点"
    {
        free(h2->cons);
        free(h2);
    }                                   // h1有"最小节点" && h2有"最小节点"
    else {
        // 将"h2中根链表"添加到"h1"中
        fib_node_cat(h1->min, h2->min);
        if (h1->min->key > h2->min->key)
            h1->min = h2->min;
        h1->keyNum += h2->keyNum;
        free(h2->cons);
        free(h2);
    }

    return h1;
}